

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_close_reason_not_utf8(void)

{
  cio_error cVar1;
  undefined1 local_38 [4];
  cio_error err;
  ws_frame frames [1];
  undefined4 local_f;
  undefined2 local_b;
  undefined1 local_9;
  uint8_t data [7];
  
  local_f = 0x88f803e8;
  local_b = 0x8080;
  local_9 = 0x80;
  cio_check_utf8_fake.return_val = '\f';
  local_38 = (undefined1  [4])0x8;
  err = CIO_SUCCESS;
  frames[0]._0_8_ = &local_f;
  frames[0].data = (void *)0x7;
  frames[0].data_length._0_1_ = 1;
  frames[0].data_length._1_1_ = 0;
  serialize_frames((ws_frame *)local_38,1);
  *(ushort *)&(ws->ws_private).ws_flags =
       *(ushort *)&(ws->ws_private).ws_flags & 0xfbff | (ushort)(err == CIO_SUCCESS) << 10;
  cVar1 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Could not start reading a message!",0x8e1,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)read_handler_fake.call_count,"read_handler was not called",0x8e3,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_val,
             "websocket parameter of read_handler not correct",0x8e4,UNITY_DISPLAY_STYLE_INT);
  if (read_handler_fake.arg1_val == (void *)0x0) {
    UnityAssertEqualNumber
              (1,(long)read_handler_fake.arg2_val,"error parameter of read_handler not CIO_SUCCESS",
               0x8e6,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_error_fake.call_count,"error callback was not called",0x8e8,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
               "websocket parameter of error handler not correct",0x8e9,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (-0x5d,(long)on_error_fake.arg1_val,"error code in error handler not correct",0x8ea,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)on_control_fake.call_count,
               "control callback was called for last close frame",0x8ec,UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("context of read handler not NULL",0x8e5);
}

Assistant:

static void test_close_reason_not_utf8(void)
{
	uint8_t data[] = {0xe8, 0x3, 0xf8, 0x88, 0x80, 0x80, 0x80};
	cio_check_utf8_fake.return_val = CIO_UTF8_REJECT;

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "read_handler was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, read_handler_fake.arg0_val, "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_val, "context of read handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_val, "error parameter of read_handler not CIO_SUCCESS");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, on_error_fake.arg0_val, "websocket parameter of error handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_PROTOCOL_NOT_SUPPORTED, on_error_fake.arg1_val, "error code in error handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.call_count, "control callback was called for last close frame");
}